

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

RegOpnd * __thiscall
Lowerer::GenerateUntagVar
          (Lowerer *this,RegOpnd *opnd,LabelInstr *labelFail,Instr *insertBeforeInstr,
          bool generateTagCheck)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  ulong uVar4;
  undefined4 *puVar5;
  IntConstOpnd *src;
  RegOpnd *pRVar6;
  
  uVar4 = (ulong)(opnd->super_Opnd).m_type;
  if (uVar4 == 0x17) {
    bVar2 = IR::Opnd::IsNotInt(&opnd->super_Opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x466e,"(!opnd->IsNotInt())",
                         "An opnd we know is not an int should not try to untag it as it will always fail"
                        );
      if (!bVar2) {
LAB_005e1f5d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar2 = StackSym::IsIntConst(opnd->m_sym);
    if (!bVar2) {
      if (generateTagCheck) {
        bVar2 = IR::Opnd::IsTaggedInt(&opnd->super_Opnd);
        bVar2 = !bVar2;
      }
      else {
        bVar2 = false;
      }
      pRVar6 = LowererMD::GenerateUntagVar
                         (&this->m_lowererMD,opnd,labelFail,insertBeforeInstr,bVar2);
      return pRVar6;
    }
    iVar3 = StackSym::GetIntConstValue(opnd->m_sym);
    src = IR::IntConstOpnd::New((long)iVar3,TyInt32,this->m_func,false);
    opnd = IR::RegOpnd::New(TyInt32,this->m_func);
    InsertMove(&opnd->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  }
  else if (TySize[uVar4] != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x466b,"(opnd->GetSize() == 4)","This should be 32-bit wide");
    if (!bVar2) goto LAB_005e1f5d;
    *puVar5 = 0;
  }
  return opnd;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateUntagVar(IR::RegOpnd * opnd, IR::LabelInstr * labelFail, IR::Instr * insertBeforeInstr, bool generateTagCheck)
{
    if (!opnd->IsVar())
    {
        AssertMsg(opnd->GetSize() == 4, "This should be 32-bit wide");
        return opnd;
    }
    AssertMsg(!opnd->IsNotInt(), "An opnd we know is not an int should not try to untag it as it will always fail");
    if (opnd->m_sym->IsIntConst())
    {
        int32 constValue = opnd->m_sym->GetIntConstValue();
        IR::IntConstOpnd* constOpnd = IR::IntConstOpnd::New(constValue, TyInt32, this->m_func);
        IR::RegOpnd* regOpnd = IR::RegOpnd::New(TyInt32, this->m_func);
        InsertMove(regOpnd, constOpnd, insertBeforeInstr);
        return regOpnd;
    }
    return m_lowererMD.GenerateUntagVar(opnd, labelFail, insertBeforeInstr, generateTagCheck && !opnd->IsTaggedInt());
}